

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseStringToStream<272u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          StackStream<char> *os)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  short extraout_AX;
  uint codepoint;
  uint uVar4;
  byte *pbVar5;
  char *pcVar6;
  RapidJSONException *this_00;
  Ch c;
  
  do {
    while( true ) {
      bVar1 = *is->current_;
      if (bVar1 != 0x5c) break;
      pbVar5 = (byte *)(is->current_ + (is->count_ - (long)is->buffer_));
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
      cVar2 = ""[(byte)*is->current_];
      if (cVar2 == '\0') {
        if (*is->current_ != 0x75) {
          if (*(int *)(this + 0x30) == 0) {
            *(undefined4 *)(this + 0x30) = 10;
LAB_00155745:
            *(byte **)(this + 0x38) = pbVar5;
            return;
          }
          this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
          cereal::RapidJSONException::RapidJSONException
                    (this_00,"rapidjson internal assertion failure: !HasParseError()");
          goto LAB_00155722;
        }
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        codepoint = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>(this,is,(size_t)pbVar5);
        if (*(int *)(this + 0x30) != 0) {
          return;
        }
        if ((codepoint & 0xfffffc00) == 0xd800) {
          if ((*is->current_ != '\\') ||
             (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is),
             *is->current_ != 'u')) {
            if (*(int *)(this + 0x30) == 0) {
              *(undefined4 *)(this + 0x30) = 9;
              goto LAB_00155745;
            }
            this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
            cereal::RapidJSONException::RapidJSONException
                      (this_00,"rapidjson internal assertion failure: !HasParseError()");
            goto LAB_00155722;
          }
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
          uVar4 = ParseHex4<rapidjson::BasicIStreamWrapper<std::istream>>(this,is,(size_t)pbVar5);
          if (*(int *)(this + 0x30) == 0) {
            if (uVar4 - 0xe000 < 0xfffffc00) {
              *(undefined4 *)(this + 0x30) = 9;
              *(byte **)(this + 0x38) = pbVar5;
              goto LAB_001556ae;
            }
            codepoint = codepoint * 0x400 + uVar4 + 0xfca02400;
            bVar3 = true;
          }
          else {
LAB_001556ae:
            bVar3 = false;
          }
          if (!bVar3) {
            return;
          }
        }
        UTF8<char>::
        Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                  (os,codepoint);
      }
      else {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
        pcVar6 = internal::Stack<rapidjson::CrtAllocator>::Push<char>(os->stack_,1);
        *pcVar6 = cVar2;
        os->length_ = os->length_ + 1;
      }
    }
    if (bVar1 == 0x22) {
      ParseStringToStream<272u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                ();
      return;
    }
    if (bVar1 < 0x20) {
      ParseStringToStream<272u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                ();
      if (extraout_AX == 1) {
        return;
      }
      if (extraout_AX == 0) {
        this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
        cereal::RapidJSONException::RapidJSONException
                  (this_00,"rapidjson internal assertion failure: !HasParseError()");
      }
      else {
        this_00 = (RapidJSONException *)__cxa_allocate_exception(0x10);
        cereal::RapidJSONException::RapidJSONException
                  (this_00,"rapidjson internal assertion failure: !HasParseError()");
      }
LAB_00155722:
      __cxa_throw(this_00,&cereal::RapidJSONException::typeinfo,std::runtime_error::~runtime_error);
    }
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read(is);
    pbVar5 = (byte *)internal::Stack<rapidjson::CrtAllocator>::Push<char>(os->stack_,1);
    *pbVar5 = bVar1;
    os->length_ = os->length_ + 1;
  } while( true );
}

Assistant:

CEREAL_RAPIDJSON_FORCEINLINE void ParseStringToStream(InputStream& is, OutputStream& os) {
//!@cond CEREAL_RAPIDJSON_HIDDEN_FROM_DOXYGEN
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
        static const char escape[256] = {
            Z16, Z16, 0, 0,'\"', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'/',
            Z16, Z16, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,'\\', 0, 0, 0,
            0, 0,'\b', 0, 0, 0,'\f', 0, 0, 0, 0, 0, 0, 0,'\n', 0,
            0, 0,'\r', 0,'\t', 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16
        };
#undef Z16
//!@endcond

        for (;;) {
            // Scan and copy string before "\\\"" or < 0x20. This is an optional optimzation.
            if (!(parseFlags & kParseValidateEncodingFlag))
                ScanCopyUnescapedString(is, os);

            Ch c = is.Peek();
            if (CEREAL_RAPIDJSON_UNLIKELY(c == '\\')) {    // Escape
                size_t escapeOffset = is.Tell();    // For invalid escaping, report the initial '\\' as error offset
                is.Take();
                Ch e = is.Peek();
                if ((sizeof(Ch) == 1 || unsigned(e) < 256) && CEREAL_RAPIDJSON_LIKELY(escape[static_cast<unsigned char>(e)])) {
                    is.Take();
                    os.Put(static_cast<typename TEncoding::Ch>(escape[static_cast<unsigned char>(e)]));
                }
                else if (CEREAL_RAPIDJSON_LIKELY(e == 'u')) {    // Unicode
                    is.Take();
                    unsigned codepoint = ParseHex4(is, escapeOffset);
                    CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                    if (CEREAL_RAPIDJSON_UNLIKELY(codepoint >= 0xD800 && codepoint <= 0xDBFF)) {
                        // Handle UTF-16 surrogate pair
                        if (CEREAL_RAPIDJSON_UNLIKELY(!Consume(is, '\\') || !Consume(is, 'u')))
                            CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        unsigned codepoint2 = ParseHex4(is, escapeOffset);
                        CEREAL_RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
                        if (CEREAL_RAPIDJSON_UNLIKELY(codepoint2 < 0xDC00 || codepoint2 > 0xDFFF))
                            CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringUnicodeSurrogateInvalid, escapeOffset);
                        codepoint = (((codepoint - 0xD800) << 10) | (codepoint2 - 0xDC00)) + 0x10000;
                    }
                    TEncoding::Encode(os, codepoint);
                }
                else
                    CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringEscapeInvalid, escapeOffset);
            }
            else if (CEREAL_RAPIDJSON_UNLIKELY(c == '"')) {    // Closing double quote
                is.Take();
                os.Put('\0');   // null-terminate the string
                return;
            }
            else if (CEREAL_RAPIDJSON_UNLIKELY(static_cast<unsigned>(c) < 0x20)) { // RFC 4627: unescaped = %x20-21 / %x23-5B / %x5D-10FFFF
                if (c == '\0')
                    CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringMissQuotationMark, is.Tell());
                else
                    CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, is.Tell());
            }
            else {
                size_t offset = is.Tell();
                if (CEREAL_RAPIDJSON_UNLIKELY((parseFlags & kParseValidateEncodingFlag ?
                    !Transcoder<SEncoding, TEncoding>::Validate(is, os) :
                    !Transcoder<SEncoding, TEncoding>::Transcode(is, os))))
                    CEREAL_RAPIDJSON_PARSE_ERROR(kParseErrorStringInvalidEncoding, offset);
            }
        }
    }